

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGValidStatePtr xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGStatesPtr pxVar2;
  uint uVar3;
  xmlNodePtr pxVar4;
  xmlRelaxNGValidStatePtr pxVar5;
  xmlAttrPtr *ppxVar6;
  _xmlAttr *p_Var7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  xmlAttrPtr attrs [20];
  long local_c8 [20];
  
  if (node == (xmlNodePtr)0x0) {
    pxVar4 = xmlDocGetRootElement(ctxt->doc);
    uVar10 = 0;
    if (pxVar4 != (xmlNodePtr)0x0) goto LAB_0018227d;
LAB_00182343:
    pxVar5 = (xmlRelaxNGValidStatePtr)0x0;
  }
  else {
    uVar10 = 0;
    for (p_Var7 = node->properties; p_Var7 != (_xmlAttr *)0x0; p_Var7 = p_Var7->next) {
      if (uVar10 < 0x14) {
        local_c8[uVar10] = (long)p_Var7;
      }
      uVar10 = uVar10 + 1;
    }
    pxVar4 = (xmlNodePtr)0x0;
LAB_0018227d:
    pxVar2 = ctxt->freeState;
    if (pxVar2 == (xmlRelaxNGStatesPtr)0x0) {
LAB_0018229f:
      pxVar5 = (xmlRelaxNGValidStatePtr)(*xmlMalloc)(0x38);
      if (pxVar5 == (xmlRelaxNGValidStatePtr)0x0) {
        xmlRngVErrMemory(ctxt);
        goto LAB_00182343;
      }
      pxVar5->value = (xmlChar *)0x0;
      pxVar5->endvalue = (xmlChar *)0x0;
      pxVar5->nbAttrs = 0;
      pxVar5->maxAttrs = 0;
      *(undefined8 *)&pxVar5->nbAttrLeft = 0;
      pxVar5->node = (xmlNodePtr)0x0;
      pxVar5->seq = (xmlNodePtr)0x0;
      pxVar5->attrs = (xmlAttrPtr *)0x0;
    }
    else {
      iVar1 = pxVar2->nbState;
      if ((long)iVar1 < 1) goto LAB_0018229f;
      pxVar2->nbState = iVar1 + -1;
      pxVar5 = pxVar2->tabState[(long)iVar1 + -1];
    }
    pxVar5->value = (xmlChar *)0x0;
    pxVar5->endvalue = (xmlChar *)0x0;
    if (node == (xmlNodePtr)0x0) {
      pxVar5->node = (xmlNodePtr)ctxt->doc;
    }
    else {
      pxVar5->node = node;
      pxVar4 = node->children;
    }
    pxVar5->seq = pxVar4;
    pxVar5->nbAttrs = 0;
    uVar9 = (uint)uVar10;
    if (uVar9 != 0) {
      if (pxVar5->attrs == (xmlAttrPtr *)0x0) {
        uVar3 = 4;
        if (4 < uVar9) {
          uVar3 = uVar9;
        }
        pxVar5->maxAttrs = uVar3;
        ppxVar6 = (xmlAttrPtr *)(*xmlMalloc)((long)(int)uVar3 << 3);
        pxVar5->attrs = ppxVar6;
        if (ppxVar6 == (xmlAttrPtr *)0x0) {
          xmlRngVErrMemory(ctxt);
          return pxVar5;
        }
      }
      else if (pxVar5->maxAttrs < (int)uVar9) {
        ppxVar6 = (xmlAttrPtr *)(*xmlRealloc)(pxVar5->attrs,(uVar10 & 0xffffffff) << 3);
        if (ppxVar6 == (xmlAttrPtr *)0x0) {
          xmlRngVErrMemory(ctxt);
          return pxVar5;
        }
        pxVar5->attrs = ppxVar6;
        pxVar5->maxAttrs = uVar9;
      }
      pxVar5->nbAttrs = uVar9;
      if (uVar9 < 0x14) {
        memcpy(pxVar5->attrs,local_c8,(ulong)(uVar9 << 3));
      }
      else {
        p_Var7 = node->properties;
        if (p_Var7 != (_xmlAttr *)0x0) {
          lVar8 = 0;
          do {
            *(_xmlAttr **)((long)pxVar5->attrs + lVar8) = p_Var7;
            p_Var7 = p_Var7->next;
            lVar8 = lVar8 + 8;
          } while (p_Var7 != (_xmlAttr *)0x0);
        }
      }
    }
    pxVar5->nbAttrLeft = pxVar5->nbAttrs;
  }
  return pxVar5;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGValidStatePtr ret;
    xmlAttrPtr attr;
    xmlAttrPtr attrs[MAX_ATTR];
    int nbAttrs = 0;
    xmlNodePtr root = NULL;

    if (node == NULL) {
        root = xmlDocGetRootElement(ctxt->doc);
        if (root == NULL)
            return (NULL);
    } else {
        attr = node->properties;
        while (attr != NULL) {
            if (nbAttrs < MAX_ATTR)
                attrs[nbAttrs++] = attr;
            else
                nbAttrs++;
            attr = attr->next;
        }
    }
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    ret->value = NULL;
    ret->endvalue = NULL;
    if (node == NULL) {
        ret->node = (xmlNodePtr) ctxt->doc;
        ret->seq = root;
    } else {
        ret->node = node;
        ret->seq = node->children;
    }
    ret->nbAttrs = 0;
    if (nbAttrs > 0) {
        if (ret->attrs == NULL) {
            if (nbAttrs < 4)
                ret->maxAttrs = 4;
            else
                ret->maxAttrs = nbAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
        } else if (ret->maxAttrs < nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, nbAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
            ret->attrs = tmp;
            ret->maxAttrs = nbAttrs;
        }
        ret->nbAttrs = nbAttrs;
        if (nbAttrs < MAX_ATTR) {
            memcpy(ret->attrs, attrs, sizeof(xmlAttrPtr) * nbAttrs);
        } else {
            attr = node->properties;
            nbAttrs = 0;
            while (attr != NULL) {
                ret->attrs[nbAttrs++] = attr;
                attr = attr->next;
            }
        }
    }
    ret->nbAttrLeft = ret->nbAttrs;
    return (ret);
}